

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O2

void OPSG_SetMuteMask(void *chip,UINT32 MuteMask)

{
  uint uVar1;
  Uint8 CurChn;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    uVar1 = MuteMask >> ((byte)lVar2 & 0x1f);
    *(byte *)((long)chip + lVar2 + 0x650) = (byte)uVar1 & 1;
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)((long)chip + lVar2 * 4 + 0x5e0) = 0;
      *(undefined4 *)((long)chip + lVar2 * 4 + 0x600) = 0;
    }
  }
  return;
}

Assistant:

static void OPSG_SetMuteMask(void* chip, UINT32 MuteMask)
{
	Uint8 CurChn;
	
	for (CurChn = 0; CurChn < N_CHANNEL; CurChn ++)
		OPSG_SetMutePsgChannel(chip, CurChn, (MuteMask >> CurChn) & 0x01);
	
	return;
}